

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

bool __thiscall
crnlib::symbol_codec::decode_receive_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,
          static_huffman_data_model *pDeltaModel)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  byte *pbVar7;
  static_huffman_data_model *in_RDX;
  long in_RSI;
  int codesize;
  uint i_1;
  uint n;
  uint end;
  uint prev;
  uint len_2;
  uint len_1;
  uint len;
  uint code;
  uint num_remaining;
  uint ofs;
  uint i;
  static_huffman_data_model dm;
  uint num_codelength_codes_to_send;
  uint total_used_syms;
  static_huffman_data_model *in_stack_fffffffffffffee0;
  uint num_bits;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  static_huffman_data_model *in_stack_fffffffffffffef0;
  uint in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int local_a0;
  uint local_9c;
  uint local_8c;
  uchar local_80;
  uint local_78;
  uint local_70;
  vector<unsigned_char> local_48 [2];
  uint local_28;
  uint local_24;
  static_huffman_data_model *local_20;
  long local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  math::total_bits(0x2000);
  local_24 = decode_bits((symbol_codec *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                         (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  if (local_24 == 0) {
    static_huffman_data_model::clear(in_stack_fffffffffffffee0);
    local_1 = true;
  }
  else {
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
    puVar6 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(local_18 + 0x18),0);
    memset(puVar6,0,(ulong)local_24);
    local_28 = decode_bits((symbol_codec *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                           (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    if ((local_28 == 0) || (0x15 < local_28)) {
      local_1 = false;
    }
    else {
      static_huffman_data_model::static_huffman_data_model(in_stack_fffffffffffffef0);
      vector<unsigned_char>::resize
                ((vector<unsigned_char> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                 SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
      for (local_70 = 0; local_70 < local_28; local_70 = local_70 + 1) {
        uVar3 = decode_bits((symbol_codec *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20));
        puVar6 = vector<unsigned_char>::operator[]
                           (local_48,(uint)(byte)g_most_probable_codelength_codes[local_70]);
        *puVar6 = (uchar)uVar3;
      }
      bVar2 = static_huffman_data_model::prepare_decoder_tables
                        ((static_huffman_data_model *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      if (bVar2) {
        local_78 = 0;
        while (local_78 < local_24) {
          uVar4 = local_24 - local_78;
          uVar3 = decode((symbol_codec *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         (static_huffman_data_model *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          if (uVar3 < 0x11) {
            local_80 = (uchar)uVar3;
            puVar6 = vector<unsigned_char>::operator[]
                               ((vector<unsigned_char> *)(local_18 + 0x18),local_78);
            *puVar6 = local_80;
            local_78 = local_78 + 1;
          }
          else {
            num_bits = (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20);
            if (uVar3 == 0x11) {
              uVar3 = decode_bits((symbol_codec *)
                                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                  num_bits);
              if (uVar4 < uVar3 + 3) {
                local_1 = false;
                goto LAB_002344d1;
              }
              local_78 = uVar3 + 3 + local_78;
            }
            else if (uVar3 == 0x12) {
              uVar3 = decode_bits((symbol_codec *)
                                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                  num_bits);
              if (uVar4 < uVar3 + 0xb) {
                local_1 = false;
                goto LAB_002344d1;
              }
              local_78 = uVar3 + 0xb + local_78;
            }
            else {
              if ((uVar3 != 0x13) && (uVar3 != 0x14)) {
                local_1 = false;
                goto LAB_002344d1;
              }
              if (uVar3 == 0x13) {
                uVar3 = decode_bits((symbol_codec *)
                                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                    num_bits);
                local_8c = uVar3 + 3;
              }
              else {
                uVar3 = decode_bits((symbol_codec *)
                                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                    num_bits);
                local_8c = uVar3 + 7;
              }
              if ((local_78 == 0) || (uVar4 < local_8c)) {
                local_1 = false;
                goto LAB_002344d1;
              }
              puVar6 = vector<unsigned_char>::operator[]
                                 ((vector<unsigned_char> *)(local_18 + 0x18),local_78 - 1);
              uVar1 = *puVar6;
              if (uVar1 == '\0') {
                local_1 = false;
                goto LAB_002344d1;
              }
              local_8c = local_78 + local_8c;
              while (local_78 < local_8c) {
                in_stack_ffffffffffffff0c = CONCAT13(uVar1,(int3)in_stack_ffffffffffffff0c);
                puVar6 = vector<unsigned_char>::operator[]
                                   ((vector<unsigned_char> *)(local_18 + 0x18),local_78);
                *puVar6 = (uchar)((uint)in_stack_ffffffffffffff0c >> 0x18);
                local_78 = local_78 + 1;
              }
            }
          }
        }
        if (local_78 == local_24) {
          if ((local_20 != (static_huffman_data_model *)0x0) &&
             (uVar3 = static_huffman_data_model::get_total_syms(local_20), uVar3 != 0)) {
            in_stack_ffffffffffffff04 = vector<unsigned_char>::size(&local_20->m_code_sizes);
            uVar4 = math::minimum<unsigned_int>(in_stack_ffffffffffffff04,local_24);
            in_stack_ffffffffffffff00 = uVar4;
            for (local_9c = 0; local_9c < uVar4; local_9c = local_9c + 1) {
              pbVar7 = vector<unsigned_char>::operator[]
                                 ((vector<unsigned_char> *)(local_18 + 0x18),local_9c);
              uVar5 = (uint)*pbVar7;
              pbVar7 = vector<unsigned_char>::operator[](&local_20->m_code_sizes,local_9c);
              local_a0 = uVar5 + *pbVar7;
              if (0x10 < local_a0) {
                local_a0 = local_a0 + -0x11;
              }
              in_stack_fffffffffffffee0 =
                   (static_huffman_data_model *)
                   vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)(local_18 + 0x18),local_9c);
              *(uchar *)&in_stack_fffffffffffffee0->m_total_syms = (uchar)local_a0;
            }
          }
          local_1 = static_huffman_data_model::prepare_decoder_tables
                              ((static_huffman_data_model *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
LAB_002344d1:
      static_huffman_data_model::~static_huffman_data_model(in_stack_fffffffffffffee0);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool symbol_codec::decode_receive_static_huffman_data_model(static_huffman_data_model& model, static_huffman_data_model* pDeltaModel) {
  CRNLIB_ASSERT(m_mode == cDecoding);

  const uint total_used_syms = decode_bits(math::total_bits(prefix_coding::cMaxSupportedSyms));
  if (!total_used_syms) {
    model.clear();
    return true;
  }

  model.m_code_sizes.resize(total_used_syms);
  memset(&model.m_code_sizes[0], 0, sizeof(model.m_code_sizes[0]) * total_used_syms);

  const uint num_codelength_codes_to_send = decode_bits(5);
  if ((num_codelength_codes_to_send < 1) || (num_codelength_codes_to_send > cMaxCodelengthCodes))
    return false;

  static_huffman_data_model dm;
  dm.m_code_sizes.resize(cMaxCodelengthCodes);

  for (uint i = 0; i < num_codelength_codes_to_send; i++)
    dm.m_code_sizes[g_most_probable_codelength_codes[i]] = static_cast<uint8>(decode_bits(3));

  if (!dm.prepare_decoder_tables())
    return false;

  uint ofs = 0;
  while (ofs < total_used_syms) {
    const uint num_remaining = total_used_syms - ofs;

    uint code = decode(dm);
    if (code <= 16)
      model.m_code_sizes[ofs++] = static_cast<uint8>(code);
    else if (code == cSmallZeroRunCode) {
      uint len = decode_bits(cSmallZeroRunExtraBits) + cMinSmallZeroRunSize;
      if (len > num_remaining)
        return false;
      ofs += len;
    } else if (code == cLargeZeroRunCode) {
      uint len = decode_bits(cLargeZeroRunExtraBits) + cMinLargeZeroRunSize;
      if (len > num_remaining)
        return false;
      ofs += len;
    } else if ((code == cSmallRepeatCode) || (code == cLargeRepeatCode)) {
      uint len;
      if (code == cSmallRepeatCode)
        len = decode_bits(cSmallNonZeroRunExtraBits) + cSmallMinNonZeroRunSize;
      else
        len = decode_bits(cLargeNonZeroRunExtraBits) + cLargeMinNonZeroRunSize;

      if ((!ofs) || (len > num_remaining))
        return false;
      const uint prev = model.m_code_sizes[ofs - 1];
      if (!prev)
        return false;
      const uint end = ofs + len;
      while (ofs < end)
        model.m_code_sizes[ofs++] = static_cast<uint8>(prev);
    } else {
      CRNLIB_ASSERT(0);
      return false;
    }
  }

  if (ofs != total_used_syms)
    return false;

  if ((pDeltaModel) && (pDeltaModel->get_total_syms())) {
    uint n = math::minimum(pDeltaModel->m_code_sizes.size(), total_used_syms);
    for (uint i = 0; i < n; i++) {
      int codesize = model.m_code_sizes[i] + pDeltaModel->m_code_sizes[i];
      if (codesize > 16)
        codesize -= 17;
      model.m_code_sizes[i] = static_cast<uint8>(codesize);
    }
  }

  return model.prepare_decoder_tables();
}